

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase59::run(TestCase59 *this)

{
  bool bVar1;
  uint16_t uVar2;
  uint64_t uVar3;
  bool local_7b9;
  undefined1 auStack_7b8 [7];
  bool _kj_shouldLog_3;
  Maybe<capnp::StructSchema::Field> local_7a8;
  bool local_759;
  undefined1 auStack_758 [7];
  bool _kj_shouldLog_2;
  Maybe<capnp::StructSchema::Field> local_748;
  ArrayPtr<const_char> local_700;
  ArrayPtr<const_char> local_6f0;
  Field local_6e0;
  Reader local_6a0;
  Reader local_670;
  Schema local_640;
  Schema local_638;
  Field local_630;
  Reader local_5f0;
  Reader local_5c0;
  uint16_t local_58a;
  int local_588;
  bool local_581;
  undefined1 auStack_580 [7];
  bool _kj_shouldLog_1;
  ArrayPtr<const_char> local_570;
  Field local_560;
  Reader local_520;
  Reader local_4f0;
  Schema local_4c0;
  Schema local_4b8;
  Field local_4b0;
  Reader local_470;
  Reader local_440;
  ArrayPtr<const_char> local_410;
  ArrayPtr<const_char> local_400;
  Field local_3f0;
  Reader local_3b0;
  Reader local_380;
  Schema local_350;
  Schema local_348;
  Field local_340;
  Reader local_300;
  Reader local_2d0;
  uint16_t local_29a;
  int local_298;
  bool local_291;
  undefined1 auStack_290 [7];
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_280;
  Field local_270;
  Reader local_230;
  Reader local_200;
  Schema local_1d0;
  Schema local_1c8;
  Field local_1c0;
  Reader local_180;
  Reader local_150;
  Schema local_120;
  Schema local_118;
  Reader local_110;
  Schema local_e0;
  Schema local_d8;
  Schema local_d0;
  Reader local_c8;
  Schema local_98 [3];
  Schema local_80;
  Reader local_78;
  Schema local_48;
  Schema local_40;
  StructSchema schema;
  SchemaLoader loader;
  TestCase59 *this_local;
  
  SchemaLoader::SchemaLoader((SchemaLoader *)&schema);
  local_80.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestLateUnion>();
  Schema::getProto(&local_78,&local_80);
  local_48 = SchemaLoader::load((SchemaLoader *)&schema,&local_78);
  local_40.raw = (RawBrandedSchema *)Schema::asStruct(&local_48);
  local_d0.raw = (RawBrandedSchema *)
                 Schema::from<capnproto_test::capnp::test::TestLateUnion::TheUnion>();
  Schema::getProto(&local_c8,&local_d0);
  local_98[0] = SchemaLoader::load((SchemaLoader *)&schema,&local_c8);
  local_d8.raw = (RawBrandedSchema *)Schema::asStruct(local_98);
  local_118.raw =
       (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestLateUnion::AnotherUnion>();
  Schema::getProto(&local_110,&local_118);
  local_e0 = SchemaLoader::load((SchemaLoader *)&schema,&local_110);
  local_120.raw = (RawBrandedSchema *)Schema::asStruct(&local_e0);
  kj::StringPtr::StringPtr((StringPtr *)&local_280,"theUnion");
  StructSchema::getFieldByName(&local_270,(StructSchema *)&local_40,(StringPtr)local_280);
  StructSchema::Field::getProto(&local_230,&local_270);
  capnp::schema::Field::Reader::getGroup(&local_200,&local_230);
  uVar3 = capnp::schema::Field::Group::Reader::getTypeId(&local_200);
  local_1d0 = Schema::getDependency(&local_40,uVar3);
  local_1c8.raw = (RawBrandedSchema *)Schema::asStruct(&local_1d0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_290,"grault");
  StructSchema::getFieldByName(&local_1c0,(StructSchema *)&local_1c8,(StringPtr)_auStack_290);
  StructSchema::Field::getProto(&local_180,&local_1c0);
  capnp::schema::Field::Reader::getOrdinal(&local_150,&local_180);
  uVar2 = capnp::schema::Field::Ordinal::Reader::getExplicit(&local_150);
  if (uVar2 != 6) {
    local_291 = kj::_::Debug::shouldLog(ERROR);
    while (local_291 != false) {
      local_298 = 6;
      kj::StringPtr::StringPtr((StringPtr *)&local_400,"theUnion");
      StructSchema::getFieldByName(&local_3f0,(StructSchema *)&local_40,(StringPtr)local_400);
      StructSchema::Field::getProto(&local_3b0,&local_3f0);
      capnp::schema::Field::Reader::getGroup(&local_380,&local_3b0);
      uVar3 = capnp::schema::Field::Group::Reader::getTypeId(&local_380);
      local_350 = Schema::getDependency(&local_40,uVar3);
      local_348.raw = (RawBrandedSchema *)Schema::asStruct(&local_350);
      kj::StringPtr::StringPtr((StringPtr *)&local_410,"grault");
      StructSchema::getFieldByName(&local_340,(StructSchema *)&local_348,(StringPtr)local_410);
      StructSchema::Field::getProto(&local_300,&local_340);
      capnp::schema::Field::Reader::getOrdinal(&local_2d0,&local_300);
      local_29a = capnp::schema::Field::Ordinal::Reader::getExplicit(&local_2d0);
      kj::_::Debug::log<char_const(&)[191],int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x45,ERROR,
                 "\"failed: expected \" \"(6) == (schema.getDependency(schema.getFieldByName(\\\"theUnion\\\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\\\"grault\\\").getProto().getOrdinal().getExplicit())\", 6, schema.getDependency(schema.getFieldByName(\"theUnion\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\"grault\").getProto().getOrdinal().getExplicit()"
                 ,(char (*) [191])
                  "failed: expected (6) == (schema.getDependency(schema.getFieldByName(\"theUnion\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\"grault\").getProto().getOrdinal().getExplicit())"
                 ,&local_298,&local_29a);
      local_291 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_570,"anotherUnion");
  StructSchema::getFieldByName(&local_560,(StructSchema *)&local_40,(StringPtr)local_570);
  StructSchema::Field::getProto(&local_520,&local_560);
  capnp::schema::Field::Reader::getGroup(&local_4f0,&local_520);
  uVar3 = capnp::schema::Field::Group::Reader::getTypeId(&local_4f0);
  local_4c0 = Schema::getDependency(&local_40,uVar3);
  local_4b8.raw = (RawBrandedSchema *)Schema::asStruct(&local_4c0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_580,"corge");
  StructSchema::getFieldByName(&local_4b0,(StructSchema *)&local_4b8,(StringPtr)_auStack_580);
  StructSchema::Field::getProto(&local_470,&local_4b0);
  capnp::schema::Field::Reader::getOrdinal(&local_440,&local_470);
  uVar2 = capnp::schema::Field::Ordinal::Reader::getExplicit(&local_440);
  if (uVar2 != 9) {
    local_581 = kj::_::Debug::shouldLog(ERROR);
    while (local_581 != false) {
      local_588 = 9;
      kj::StringPtr::StringPtr((StringPtr *)&local_6f0,"anotherUnion");
      StructSchema::getFieldByName(&local_6e0,(StructSchema *)&local_40,(StringPtr)local_6f0);
      StructSchema::Field::getProto(&local_6a0,&local_6e0);
      capnp::schema::Field::Reader::getGroup(&local_670,&local_6a0);
      uVar3 = capnp::schema::Field::Group::Reader::getTypeId(&local_670);
      local_640 = Schema::getDependency(&local_40,uVar3);
      local_638.raw = (RawBrandedSchema *)Schema::asStruct(&local_640);
      kj::StringPtr::StringPtr((StringPtr *)&local_700,"corge");
      StructSchema::getFieldByName(&local_630,(StructSchema *)&local_638,(StringPtr)local_700);
      StructSchema::Field::getProto(&local_5f0,&local_630);
      capnp::schema::Field::Reader::getOrdinal(&local_5c0,&local_5f0);
      local_58a = capnp::schema::Field::Ordinal::Reader::getExplicit(&local_5c0);
      kj::_::Debug::log<char_const(&)[194],int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x48,ERROR,
                 "\"failed: expected \" \"(9) == (schema.getDependency(schema.getFieldByName(\\\"anotherUnion\\\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\\\"corge\\\").getProto().getOrdinal().getExplicit())\", 9, schema.getDependency(schema.getFieldByName(\"anotherUnion\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\"corge\").getProto().getOrdinal().getExplicit()"
                 ,(char (*) [194])
                  "failed: expected (9) == (schema.getDependency(schema.getFieldByName(\"anotherUnion\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\"corge\").getProto().getOrdinal().getExplicit())"
                 ,&local_588,&local_58a);
      local_581 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_758,"corge");
  StructSchema::findFieldByName(&local_748,(StructSchema *)&local_40,(StringPtr)_auStack_758);
  bVar1 = kj::Maybe<capnp::StructSchema::Field>::operator==(&local_748,(void *)0x0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_748);
  if (!bVar1) {
    local_759 = kj::_::Debug::shouldLog(ERROR);
    while (local_759 != false) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x49,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"corge\\\") == nullptr\"",
                 (char (*) [60])"failed: expected schema.findFieldByName(\"corge\") == nullptr");
      local_759 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_7b8,"grault");
  StructSchema::findFieldByName(&local_7a8,(StructSchema *)&local_40,(StringPtr)_auStack_7b8);
  bVar1 = kj::Maybe<capnp::StructSchema::Field>::operator==(&local_7a8,(void *)0x0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_7a8);
  if (!bVar1) {
    local_7b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_7b9 != false) {
      kj::_::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x4a,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"grault\\\") == nullptr\"",
                 (char (*) [61])"failed: expected schema.findFieldByName(\"grault\") == nullptr");
      local_7b9 = false;
    }
  }
  SchemaLoader::~SchemaLoader((SchemaLoader *)&schema);
  return;
}

Assistant:

TEST(SchemaLoader, LoadLateUnion) {
  SchemaLoader loader;

  StructSchema schema =
      loader.load(Schema::from<test::TestLateUnion>().getProto()).asStruct();
  loader.load(Schema::from<test::TestLateUnion::TheUnion>().getProto()).asStruct();
  loader.load(Schema::from<test::TestLateUnion::AnotherUnion>().getProto()).asStruct();

  EXPECT_EQ(6,
      schema.getDependency(schema.getFieldByName("theUnion").getProto().getGroup().getTypeId())
            .asStruct().getFieldByName("grault").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(9,
      schema.getDependency(schema.getFieldByName("anotherUnion").getProto().getGroup().getTypeId())
            .asStruct().getFieldByName("corge").getProto().getOrdinal().getExplicit());
  EXPECT_TRUE(schema.findFieldByName("corge") == nullptr);
  EXPECT_TRUE(schema.findFieldByName("grault") == nullptr);
}